

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar4 = GImGui;
  if ((window->Flags & 0x2000000) == 0) {
    fVar8 = (GImGui->Style).DisplaySafeAreaPadding.x;
    fVar9 = (GImGui->Style).DisplaySafeAreaPadding.y;
    fVar8 = (GImGui->IO).DisplaySize.x - (fVar8 + fVar8);
    fVar10 = (GImGui->IO).DisplaySize.y - (fVar9 + fVar9);
    fVar9 = (GImGui->Style).WindowMinSize.x;
    uVar5 = -(uint)(fVar8 <= fVar9);
    fVar2 = (float)(uVar5 & (uint)fVar9 | ~uVar5 & (uint)fVar8);
    fVar8 = (GImGui->Style).WindowMinSize.y;
    uVar5 = -(uint)(fVar10 <= fVar8);
    fVar3 = (float)(uVar5 & (uint)fVar8 | ~uVar5 & (uint)fVar10);
    fVar10 = size_contents->x;
    fVar1 = size_contents->y;
    if (fVar1 <= fVar3) {
      fVar3 = fVar1;
    }
    fVar8 = (float)(-(uint)(fVar1 < fVar8) & (uint)fVar8 | ~-(uint)(fVar1 < fVar8) & (uint)fVar3);
    if (fVar10 <= fVar2) {
      fVar2 = fVar10;
    }
    fVar9 = (float)(-(uint)(fVar10 < fVar9) & (uint)fVar9 | ~-(uint)(fVar10 < fVar9) & (uint)fVar2);
    IVar6.y = fVar8;
    IVar6.x = fVar9;
    IVar6 = CalcSizeAfterConstraint(window,IVar6);
    if ((IVar6.x < size_contents->x) && ((window->Flags & 0x808U) == 0x800)) {
      fVar8 = fVar8 + (pIVar4->Style).ScrollbarSize;
    }
    if ((IVar6.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      fVar9 = fVar9 + (pIVar4->Style).ScrollbarSize;
    }
  }
  else {
    fVar9 = (*size_contents).x;
    fVar8 = (*size_contents).y;
  }
  IVar7.y = fVar8;
  IVar7.x = fVar9;
  return IVar7;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        ImVec2 size_auto_fit = ImClamp(size_contents, style.WindowMinSize, ImMax(style.WindowMinSize, g.IO.DisplaySize - g.Style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}